

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::setPath(XMLUri *this,XMLCh *newPath)

{
  XMLCh *pXVar1;
  XMLCh *newPath_local;
  XMLUri *this_local;
  
  if (newPath == (XMLCh *)0x0) {
    pXVar1 = getPath(this);
    if (pXVar1 != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
    }
    this->fPath = (XMLCh *)0x0;
    setQueryString(this,(XMLCh *)0x0);
    setFragment(this,(XMLCh *)0x0);
  }
  else {
    initializePath(this,newPath);
  }
  return;
}

Assistant:

void XMLUri::setPath(const XMLCh* const newPath)
{
    if (!newPath)
    {
        if (getPath())
            fMemoryManager->deallocate(fPath);//delete [] fPath;

        fPath = 0;
        setQueryString(0);
        setFragment(0);
    }
    else
    {
        initializePath(newPath);
    }
}